

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::is_y_flipped(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  mip_level **ppmVar4;
  long in_RDI;
  uint m;
  uint l;
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  do {
    uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                      ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20));
    if (uVar2 <= local_14) {
      return false;
    }
    local_18 = 0;
    while( true ) {
      pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_14);
      uVar2 = vector<crnlib::mip_level_*>::size(pvVar3);
      if (uVar2 <= local_18) break;
      pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_14);
      ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_18);
      bVar1 = mip_level::is_y_flipped(*ppmVar4);
      if (bVar1) {
        return true;
      }
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool mipmapped_texture::is_y_flipped() const {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (m_faces[l][m]->is_y_flipped())
        return true;

  return false;
}